

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_joinref.cpp
# Opt level: O2

BindingAlias * __thiscall
duckdb::Binder::RetrieveUsingBinding
          (BindingAlias *__return_storage_ptr__,Binder *this,Binder *current_binder,
          optional_ptr<duckdb::UsingColumnSet,_true> current_set,string *using_column,
          string *join_side)

{
  UsingColumnSet *pUVar1;
  optional_ptr<duckdb::UsingColumnSet,_true> local_90;
  BindingAlias local_88;
  
  local_90.ptr = current_set.ptr;
  BindingAlias::BindingAlias(__return_storage_ptr__);
  if (current_set.ptr == (UsingColumnSet *)0x0) {
    FindBinding(&local_88,current_binder,using_column,join_side);
    BindingAlias::operator=(__return_storage_ptr__,&local_88);
    BindingAlias::~BindingAlias(&local_88);
  }
  else {
    pUVar1 = optional_ptr<duckdb::UsingColumnSet,_true>::operator->(&local_90);
    BindingAlias::operator=(__return_storage_ptr__,&pUVar1->primary_binding);
  }
  return __return_storage_ptr__;
}

Assistant:

BindingAlias Binder::RetrieveUsingBinding(Binder &current_binder, optional_ptr<UsingColumnSet> current_set,
                                          const string &using_column, const string &join_side) {
	BindingAlias binding;
	if (!current_set) {
		binding = current_binder.FindBinding(using_column, join_side);
	} else {
		binding = current_set->primary_binding;
	}
	return binding;
}